

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getJointPos(KinDynComputations *this,Span<double,__1L> q)

{
  long lVar1;
  VectorDynSize *vec;
  extent_type<_1L> eVar2;
  pointer local_50;
  long local_48;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_38;
  
  eVar2 = q.storage_.super_extent_type<_1L>.size_;
  lVar1 = iDynTree::Model::getNrOfPosCoords();
  if (lVar1 == eVar2.size_) {
    vec = (VectorDynSize *)iDynTree::FreeFloatingPos::jointPos();
    toEigen(&local_38,vec);
    local_50 = q.storage_.data_;
    local_48 = eVar2.size_;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_50,
               &local_38);
  }
  else {
    iDynTree::reportError("KinDynComputations","getJointPos","Wrong size in input q.");
  }
  return lVar1 == eVar2.size_;
}

Assistant:

bool KinDynComputations::getJointPos(Span<double> q) const
{
    bool ok = q.size() == pimpl->m_robot_model.getNrOfPosCoords();
    if( !ok )
    {
        reportError("KinDynComputations","getJointPos","Wrong size in input q.");
        return false;
    }

    toEigen(q) = toEigen(this->pimpl->m_pos.jointPos());
    return true;
}